

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86inst.cpp
# Opt level: O3

Error asmjit::X86Inst::validate
                (uint32_t archType,uint32_t instId,uint32_t options,Operand_ *extraOp,
                Operand_ *opArray,uint32_t opCount)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  Error EVar7;
  byte *pbVar8;
  uint uVar9;
  uint uVar10;
  Error EVar11;
  uint32_t uVar12;
  undefined1 *puVar13;
  ulong uVar14;
  uint uVar15;
  CodeEmitter *emitter;
  char *str;
  byte *pbVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint32_t uVar21;
  uint32_t logOptions;
  StringBuilder *this;
  uint uVar22;
  Operand_ *pOVar23;
  ulong uVar24;
  ulong uVar25;
  ushort uVar26;
  ulong uVar27;
  uint uVar28;
  Operand_ *pOVar29;
  ulong uVar30;
  ulong uVar31;
  bool bVar32;
  bool bVar33;
  OSignature oSigTranslated [6];
  Operand_ *local_b0;
  uint uStack_68;
  ushort uStack_64;
  byte abStack_61 [49];
  
  uVar24 = (ulong)opCount;
  if (2 < archType - 1) {
    return 5;
  }
  puVar13 = _x86ValidationData;
  if (archType != 1) {
    puVar13 = _x64ValidationData;
  }
  if (0x59b < instId) {
    return 3;
  }
  uVar17 = *(uint *)(X86InstDB::instData + (ulong)instId * 0xc);
  uVar3 = *(uint *)(X86InstDB::commonData + (ulong)(uVar17 >> 0x16) * 0xc);
  if ((options & 0x32000) != 0) {
    if ((options >> 0xd & 1) != 0) {
      if (opCount == 0) {
        return 0x1c;
      }
      if ((uVar3 & 0x4000) == 0 && (options & 0x30000) == 0) {
        return 0x1c;
      }
      if (((opArray->field_0)._any.signature & 7) != 2) {
        return 0x1c;
      }
    }
    if ((options & 0x30000) != 0) {
      if ((options >> 0xd & 1) == 0) {
        return 0x1b;
      }
      if ((options & 0x30000) == 0x30000) {
        return 0x1b;
      }
      if (((options >> 0x10 & 1) != 0) && ((uVar3 & 0x8000) == 0)) {
        return 0x1d;
      }
      if (((options >> 0x11 & 1) != 0) && ((uVar3 & 0x10000) == 0)) {
        return 0x1e;
      }
    }
  }
  uVar6 = options & 0xc000;
  if (uVar6 != 0) {
    if (uVar6 == 0xc000) {
      return 0x1b;
    }
    if (((options >> 0xe & 1) != 0) && ((uVar3 & 0x1000) == 0)) {
      return 0x1f;
    }
    if (((short)options < 0) && ((uVar3 & 0x2000) == 0)) {
      return 0x1f;
    }
  }
  pOVar23 = opArray;
  if (opCount == 0) {
    local_b0 = (Operand_ *)0x0;
    uVar15 = 0;
    uVar20 = 0;
    uVar24 = 0;
LAB_001236e6:
    if (archType == 1) {
      if ((uVar20 & 0x10) != 0) {
        return 0x32;
      }
    }
    else if (((uVar20 & 2) != 0) && (0xff < uVar15)) {
      return 0x31;
    }
    uVar14 = uVar24 & 0xffffffff;
    uVar17 = (uint)((ulong)*(undefined8 *)
                            (X86InstDB::commonData + (ulong)(uVar17 >> 0x16) * 0xc + 4) >> 0x20);
    uVar20 = uVar17 >> 0x12 & 0xf;
    uVar15 = (uint)uVar24;
    if (uVar20 == 0) {
LAB_00123928:
      uVar17 = (extraOp->field_0)._any.signature;
      uVar20 = uVar17 & 7;
      if (uVar20 != 0 || (options & 0x9c0000) != 0) {
        this = (StringBuilder *)(ulong)uVar3;
        if ((uVar3 >> 0x14 & 1) == 0) {
          EVar7 = 0;
          EVar11 = 0x16;
          if (uVar6 == 0) {
            EVar7 = 0x16;
          }
          bVar33 = (options & 0x9c0000) == 0;
          goto LAB_00123973;
        }
        if (uVar20 != 0) {
          if (uVar17 != 0x391) {
            return 0x21;
          }
          if ((uVar3 >> 0x18 & 1) == 0) {
            return 0x22;
          }
        }
        if (((options >> 0x17 & 1) != 0) && ((uVar3 & 0x2000000) == 0)) {
          return 0x23;
        }
        if ((options >> 0x14 & 1) != 0) {
          if (local_b0 == (Operand_ *)0x0) {
            return 0x24;
          }
          uVar17 = (local_b0->field_0)._any.signature;
          if (0xffffff < uVar17) {
            uVar17 = uVar17 >> 0x18;
            if (((uVar3 >> 0x1c & 1) != 0) && (uVar17 != 4)) {
              return 0x24;
            }
            if (((uVar3 >> 0x1d & 1) != 0) && (uVar17 != 8)) {
              return 0x24;
            }
          }
        }
        if ((options & 0xc0000) != 0) {
          if (local_b0 != (Operand_ *)0x0) {
            return 0x25;
          }
          uVar24 = (ulong)uVar3;
          if ((options >> 0x12 & 1) == 0) {
            if ((uVar3 >> 0x1b & 1) == 0) {
              return 0x25;
            }
            return 0;
          }
          if ((uVar3 >> 0x1a & 1) == 0) {
            return 0x25;
          }
          if ((uVar3 & 0x30000000) != 0) {
            if (uVar15 < 2) {
              validate();
              uVar17 = (pOVar23->field_0)._any.signature;
              uVar21 = (uint32_t)uVar24;
              switch(uVar17 & 7) {
              case 1:
                EVar7 = X86Logging::formatRegister
                                  (this,uVar21,emitter,0x13e7a0,uVar17 >> 3 & 0x1f,
                                   (pOVar23->field_0)._any.id);
                return EVar7;
              case 2:
                goto switchD_00123af4_caseD_2;
              case 3:
                uVar14 = *(ulong *)((long)&pOVar23->field_0 + 8);
                if (uVar14 < 10 || (uVar24 & 4) == 0) {
                  uVar21 = 10;
                  uVar12 = 0x80000000;
                }
                else {
                  uVar21 = 0x10;
                  uVar12 = 0;
                }
                EVar7 = StringBuilder::_opNumber(this,1,uVar14,uVar21,0,uVar12);
                return EVar7;
              case 4:
                EVar7 = Logging::formatLabel(this,uVar21,emitter,(pOVar23->field_0)._any.id);
                return EVar7;
              default:
                EVar7 = StringBuilder::_opString(this,1,"<None>",0xffffffffffffffff);
                return EVar7;
              }
            }
            if ((opArray->field_0)._any.signature != 0x40000159) {
              if (opArray[1].field_0._any.signature != 0x40000159) {
                return 0x25;
              }
              return 0;
            }
          }
        }
      }
      return 0;
    }
    uVar25 = (ulong)(uVar17 >> 8 & 0x3ff);
    pbVar8 = &X86InstDB::iSignatureData + uVar25 * 8;
    pbVar1 = pbVar8 + (ulong)uVar20 * 8;
    pOVar23 = (Operand_ *)(&DAT_0013d392 + uVar25 * 8);
    bVar5 = false;
    bVar33 = false;
    do {
      bVar2 = *pbVar8;
      if ((byte)(bVar2 >> 3 & (archType != 1) + 1U) != 0) {
        uVar17 = bVar2 & 7;
        if (uVar15 == uVar17) {
          if (uVar14 == 0) {
LAB_001238e6:
            bVar4 = false;
            uVar25 = 0;
          }
          else {
            uVar25 = 0;
            bVar4 = false;
            do {
              uVar30 = (ulong)*(byte *)((long)&pOVar23->field_0 + uVar25);
              uVar17 = (&uStack_68)[uVar25 * 2];
              if ((*(uint *)(X86InstDB::oSignatureData + uVar30 * 8) & uVar17) == 0) {
                if (((uVar17 & 0x7fc0000) == 0) ||
                   (bVar33 = true,
                   (*(uint *)(X86InstDB::oSignatureData + uVar30 * 8) & 0x7fc0000) == 0))
                goto LAB_001238e9;
              }
              else if ((((&uStack_64)[uVar25 * 4] != 0) &&
                       ((*(ushort *)(X86InstDB::oSignatureData + uVar30 * 8 + 4) &
                        (&uStack_64)[uVar25 * 4]) == 0)) ||
                      (((bVar33 = bVar4, (uVar17 & 0x7fff) != 0 &&
                        (X86InstDB::oSignatureData[uVar30 * 8 + 7] != 0)) &&
                       ((abStack_61[uVar25 * 8] & X86InstDB::oSignatureData[uVar30 * 8 + 7]) == 0)))
                      ) goto LAB_001238e9;
              bVar4 = bVar33;
              uVar25 = uVar25 + 1;
            } while (uVar14 != uVar25);
            uVar25 = uVar24 & 0xffffffff;
          }
        }
        else {
          bVar4 = false;
          if ((uVar17 - (bVar2 >> 5) != uVar15) || (uVar15 == 0)) goto LAB_001238e6;
          uVar25 = 0;
          if ((char)uVar17 != '\0') {
            uVar30 = 0;
            uVar31 = 0;
            uVar25 = 0;
            bVar4 = false;
            do {
              pbVar16 = (byte *)((long)&pOVar23->field_0 + uVar31);
              while( true ) {
                uVar27 = (ulong)*pbVar16;
                uVar20 = *(uint *)(X86InstDB::oSignatureData + uVar27 * 8);
                if (-1 < (int)uVar20) break;
                uVar20 = (int)uVar31 + 1;
                uVar31 = (ulong)uVar20;
                pbVar16 = pbVar16 + 1;
                if (uVar17 <= uVar20) {
                  uVar25 = uVar30 & 0xffffffff;
                  goto LAB_001238e9;
                }
              }
              uVar9 = (&uStack_68)[uVar30 * 2];
              if ((uVar9 & uVar20) == 0) {
                if (((uVar20 & 0x7fc0000) == 0) || (bVar33 = true, (uVar9 & 0x7fc0000) == 0)) {
LAB_00123917:
                  uVar25 = uVar30 & 0xffffffff;
                  break;
                }
              }
              else if ((((&uStack_64)[uVar30 * 4] != 0) &&
                       ((*(ushort *)(X86InstDB::oSignatureData + uVar27 * 8 + 4) &
                        (&uStack_64)[uVar30 * 4]) == 0)) ||
                      ((bVar33 = bVar4, (uVar9 & 0x7fff) != 0 &&
                       ((X86InstDB::oSignatureData[uVar27 * 8 + 7] != 0 &&
                        ((abStack_61[uVar30 * 8] & X86InstDB::oSignatureData[uVar27 * 8 + 7]) == 0))
                       )))) goto LAB_00123917;
              bVar4 = bVar33;
              uVar30 = uVar30 + 1;
              uVar25 = (ulong)((int)uVar25 + 1);
              if ((uVar14 <= uVar30) ||
                 (uVar20 = (int)uVar31 + 1, uVar31 = (ulong)uVar20, uVar17 <= uVar20)) break;
            } while( true );
          }
        }
LAB_001238e9:
        bVar32 = (uint)uVar25 == uVar15;
        bVar33 = bVar5;
        if (bVar32) {
          bVar33 = bVar4;
        }
        bVar5 = bVar33;
        if (!bVar4 && bVar32) {
          if (pbVar8 != pbVar1) goto LAB_00123928;
          break;
        }
      }
      pbVar8 = pbVar8 + 8;
      pOVar23 = (Operand_ *)((long)&pOVar23->field_0 + 8);
    } while (pbVar8 != pbVar1);
    bVar33 = !bVar33;
    EVar11 = 0x2c;
    EVar7 = 0x16;
LAB_00123973:
    if (!bVar33) {
      EVar7 = EVar11;
    }
switchD_0012334c_default:
    return EVar7;
  }
  uVar9 = 0x4032;
  if (archType != 1) {
    uVar9 = 0x4062;
  }
  uVar10 = 0xe30;
  if (archType != 1) {
    uVar10 = 0xe60;
  }
  uVar14 = (ulong)opCount;
  uVar25 = 0;
  uVar20 = 0;
  uVar15 = 0;
  local_b0 = (Operand_ *)0x0;
  pOVar29 = opArray;
LAB_0012332e:
  uVar28 = (pOVar29->field_0)._any.signature;
  EVar7 = 4;
  switch(uVar28 & 7) {
  case 0:
    pOVar29 = opArray + uVar14;
    uVar24 = uVar14;
    while( true ) {
      uVar24 = uVar24 - 1;
      pOVar29 = pOVar29 + -1;
      if (uVar24 <= uVar25) break;
      if ((undefined1  [16])((undefined1  [16])pOVar29->field_0 & (undefined1  [16])0x7) !=
          (undefined1  [16])0x0) {
        return 4;
      }
    }
    goto LAB_001236e6;
  case 1:
    uVar28 = uVar28 >> 3 & 0x1f;
    if (0x15 < uVar28) {
      return 0x17;
    }
    uVar19 = *(uint *)(_x86OpFlagFromRegType + (ulong)uVar28 * 4);
    if (uVar19 == 0) {
      return 0x17;
    }
    uVar18 = (pOVar29->field_0)._any.id;
    if (uVar18 < 0x100) {
      if (0x1f < uVar18) {
        return 0x19;
      }
      uVar22 = 1 << ((byte)uVar18 & 0x1f);
      pOVar23 = (Operand_ *)(ulong)uVar22;
      if ((*(uint *)(puVar13 + (ulong)uVar28 * 4) >> (uVar18 & 0x1f) & 1) == 0) {
        return 0x19;
      }
      uVar15 = uVar15 | uVar22;
    }
    else {
      pOVar23 = (Operand_ *)0xffffffff;
    }
    goto LAB_001233dc;
  case 2:
    if ((~uVar28 & 0x1c0000) == 0) {
      return 0x2b;
    }
    uVar18 = uVar28 >> 3 & 0x1f;
    uVar19 = uVar28 >> 8 & 0x1f;
    if (uVar18 == 0) {
      if ((archType == 1) && (2 < (pOVar29->field_0)._mem.field_2.offset64 + 0x80000000 >> 0x1f)) {
        return 0x26;
      }
      if (uVar19 != 0) goto LAB_001234b1;
      uVar19 = 0x10000;
      pOVar23 = (Operand_ *)0x0;
      uVar26 = 0;
    }
    else {
      uVar22 = (pOVar29->field_0)._any.reserved12_4;
      if ((-1 < (short)uVar28) && ((uVar9 >> uVar18 & 1) == 0)) {
        return 0x26;
      }
      pOVar23 = (Operand_ *)0xffffffff;
      if (uVar22 < 0x100) {
        if (0x1f < uVar22) {
          validate();
          goto LAB_00123a85;
        }
        pOVar23 = (Operand_ *)(ulong)(uint)(1 << ((byte)uVar22 & 0x1f));
        uVar15 = uVar15 | 1 << (uVar22 & 0x1f);
      }
      if (uVar19 == 0) {
        uVar26 = (ushort)((pOVar29->field_0)._any.reserved8_4 == 0) << 0xb;
        uVar19 = 0x10000;
      }
      else {
LAB_001234b1:
        if ((uVar10 >> uVar19 & 1) == 0) {
          return 0x26;
        }
        uVar19 = uVar19 - 9;
        uVar26 = (ushort)(0x4400220011 >> ((char)uVar19 * '\x10' & 0x3fU));
        if (uVar19 >= 3) {
          uVar26 = (ushort)(uVar18 != 0) << 0xe;
        }
        uVar19 = (uint)(uVar19 < 3) * 0x10000 + 0x10000;
        uVar18 = (pOVar29->field_0)._any.id;
        pOVar23 = (Operand_ *)0x0;
        if (uVar18 < 0x100) {
          if (0x1f < uVar18) {
LAB_00123a85:
            validate();
            return 0x1b;
          }
          uVar15 = uVar15 | 1 << (uVar18 & 0x1f);
        }
      }
    }
    uVar28 = uVar28 >> 0x18;
    EVar7 = 0x2d;
    local_b0 = pOVar29;
    switch(uVar28) {
    case 0:
      uVar26 = uVar26 | 0x8000;
      break;
    case 1:
      uVar26 = uVar26 | 1;
      break;
    case 2:
      uVar26 = uVar26 | 2;
      break;
    case 3:
    case 5:
    case 7:
    case 9:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
      goto switchD_0012334c_default;
    case 4:
      uVar26 = uVar26 | 4;
      break;
    case 6:
      uVar26 = uVar26 | 8;
      break;
    case 8:
      uVar26 = uVar26 | 0x10;
      break;
    case 10:
      uVar26 = uVar26 | 0x20;
      break;
    case 0x10:
      uVar26 = uVar26 | 0x40;
      break;
    default:
      if (uVar28 == 0x20) {
        uVar26 = uVar26 | 0x80;
      }
      else {
        if (uVar28 != 0x40) {
          return 0x2d;
        }
        uVar26 = uVar26 | 0x100;
      }
    }
    goto LAB_001235e6;
  case 3:
    uVar30 = *(ulong *)((long)&pOVar29->field_0 + 8);
    if ((long)uVar30 < 0) {
      uVar30 = -uVar30;
      if (uVar30 < 0x81) {
        uVar19 = 0x2a80000;
      }
      else if (uVar30 < 0x8001) {
        uVar19 = 0x2a00000;
      }
      else {
        uVar19 = (uVar30 < 0x80000001 | 4) << 0x17;
      }
    }
    else if (uVar30 < 0x10) {
      uVar19 = 0x7fc0000;
    }
    else if (uVar30 < 0x80) {
      uVar19 = 0x7f80000;
    }
    else if (uVar30 < 0x100) {
      uVar19 = 0x7f00000;
    }
    else if (uVar30 < 0x8000) {
      uVar19 = 0x7e00000;
    }
    else if (uVar30 < 0x10000) {
      uVar19 = 0x7c00000;
    }
    else if (uVar30 >> 0x1f == 0) {
      uVar19 = 0x7800000;
    }
    else {
      uVar19 = (uVar30 >> 0x20 == 0 | 6) << 0x18;
    }
    break;
  case 4:
    uVar19 = 0x18000000;
    break;
  default:
    goto switchD_0012334c_default;
  }
  pOVar23 = (Operand_ *)0x0;
LAB_001233dc:
  uVar26 = 0;
LAB_001235e6:
  (&uStack_68)[uVar25 * 2] = uVar19;
  (&uStack_64)[uVar25 * 4] = uVar26;
  abStack_61[uVar25 * 8] = (byte)pOVar23;
  uVar20 = uVar20 | uVar19;
  uVar25 = uVar25 + 1;
  pOVar29 = pOVar29 + 1;
  if (uVar14 == uVar25) goto LAB_001236e6;
  goto LAB_0012332e;
switchD_00123af4_caseD_2:
  uVar17 = uVar17 >> 0x18;
  switch(uVar17) {
  case 1:
    str = "byte ";
    break;
  case 2:
    str = "word ";
    break;
  case 3:
  case 5:
  case 7:
  case 9:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
switchD_00123b78_caseD_3:
    str = "";
    break;
  case 4:
    str = "dword ";
    break;
  case 6:
    str = "fword ";
    break;
  case 8:
    str = "qword ";
    break;
  case 10:
    str = "tword ";
    break;
  case 0x10:
    str = "oword ";
    break;
  default:
    if (uVar17 == 0x20) {
      str = "yword ";
    }
    else {
      if (uVar17 != 0x40) goto switchD_00123b78_caseD_3;
      str = "zword ";
    }
  }
  EVar7 = StringBuilder::_opString(this,1,str,0xffffffffffffffff);
  if (EVar7 == 0) {
    uVar17 = (pOVar23->field_0)._any.signature >> 0x12 & 7;
    uVar12 = uVar17 - 1;
    if (uVar12 < 6) {
      uVar12 = 0x13e990;
      EVar7 = StringBuilder::appendFormat(this,"%s:",(ulong)uVar17 * 4 + 0x13ea70);
      if (EVar7 != 0) {
        return EVar7;
      }
    }
    logOptions = 1;
    EVar7 = StringBuilder::_opChar(this,1,'[');
    if (EVar7 == 0) {
      uVar17 = (pOVar23->field_0)._any.signature;
      if ((uVar17 >> 0xd & 1) != 0) {
        logOptions = 1;
        uVar12 = 0xffffffff;
        EVar7 = StringBuilder::_opString(this,1,"abs ",0xffffffffffffffff);
        if (EVar7 != 0) {
          return EVar7;
        }
        uVar17 = (pOVar23->field_0)._any.signature;
      }
      if ((uVar17 & 0xf8) != 0) {
        if ((uVar17 & 0xf8) == 8) {
          EVar7 = Logging::formatLabel(this,uVar21,emitter,(pOVar23->field_0)._any.reserved12_4);
        }
        else {
          if ((uVar17 >> 0xe & 1) != 0) {
            logOptions = 1;
            uVar12 = 0xffffffff;
            EVar7 = StringBuilder::_opString(this,1,"$",0xffffffffffffffff);
            if (EVar7 != 0) {
              return EVar7;
            }
            uVar17 = (pOVar23->field_0)._any.signature;
          }
          if ((short)uVar17 < 0) {
            logOptions = 1;
            uVar12 = 0xffffffff;
            EVar7 = StringBuilder::_opString(this,1,"&",0xffffffffffffffff);
            if (EVar7 != 0) {
              return EVar7;
            }
            uVar17 = (pOVar23->field_0)._any.signature;
          }
          EVar7 = X86Logging::formatRegister
                            (this,logOptions,emitter,uVar12,uVar17 >> 3 & 0x1f,
                             (pOVar23->field_0)._any.reserved12_4);
        }
        if (EVar7 != 0) {
          return EVar7;
        }
      }
      uVar17 = (pOVar23->field_0)._any.signature;
      if ((uVar17 & 0x1f00) != 0) {
        uVar21 = 1;
        EVar7 = StringBuilder::_opChar(this,1,'+');
        if (EVar7 != 0) {
          return EVar7;
        }
        EVar7 = X86Logging::formatRegister
                          (this,uVar21,emitter,uVar17,(pOVar23->field_0)._any.signature >> 8 & 0x1f,
                           (pOVar23->field_0)._any.id);
        if (EVar7 != 0) {
          return EVar7;
        }
        uVar17 = (pOVar23->field_0)._any.signature;
        if ((uVar17 & 0x30000) != 0) {
          EVar7 = StringBuilder::appendFormat
                            (this,"*%u",(ulong)(uint)(1 << ((byte)(uVar17 >> 0x10) & 3)));
          if (EVar7 != 0) {
            return EVar7;
          }
          uVar17 = (pOVar23->field_0)._any.signature;
        }
      }
      uVar14 = *(ulong *)((long)&pOVar23->field_0 + 8);
      uVar25 = (long)(int)uVar14;
      if ((uVar17 & 0xf8) == 0) {
        uVar25 = uVar14;
      }
      if (uVar25 == 0) {
LAB_00123e6f:
        EVar7 = StringBuilder::_opChar(this,1,']');
        return EVar7;
      }
      uVar14 = -uVar25;
      if (0 < (long)uVar25) {
        uVar14 = uVar25;
      }
      EVar7 = StringBuilder::_opChar(this,1,(char)((long)uVar25 >> 0x3f) * -2 + '+');
      if (EVar7 == 0) {
        uVar21 = 10;
        if (((uVar24 & 8) != 0) && (9 < uVar14)) {
          EVar7 = StringBuilder::_opString(this,1,"0x",2);
          if (EVar7 != 0) {
            return EVar7;
          }
          uVar21 = 0x10;
        }
        EVar7 = StringBuilder::_opNumber(this,1,uVar14,uVar21,0,0);
        if (EVar7 == 0) goto LAB_00123e6f;
      }
    }
  }
  return EVar7;
}

Assistant:

ASMJIT_FAVOR_SIZE Error X86Inst::validate(
  uint32_t archType,
  uint32_t instId, uint32_t options,
  const Operand_& extraOp, const Operand_* opArray, uint32_t opCount) noexcept {

  uint32_t i;
  uint32_t archMask;
  const X86ValidationData* vd;

  if (!ArchInfo::isX86Family(archType))
    return DebugUtils::errored(kErrorInvalidArch);

  if (archType == ArchInfo::kTypeX86) {
    vd = &_x86ValidationData;
    archMask = X86Inst::kArchMaskX86;
  }
  else {
    vd = &_x64ValidationData;
    archMask = X86Inst::kArchMaskX64;
  }

  // Get the instruction data.
  if (ASMJIT_UNLIKELY(instId >= X86Inst::_kIdCount))
    return DebugUtils::errored(kErrorInvalidArgument);

  const X86Inst* iData = &X86InstDB::instData[instId];
  uint32_t iFlags = iData->getFlags();

  // Validate LOCK, XACQUIRE, and XRELEASE prefixes.
  const uint32_t kLockXAcqRel = X86Inst::kOptionXAcquire | X86Inst::kOptionXRelease;
  if (options & (X86Inst::kOptionLock | kLockXAcqRel)) {
    if (options & X86Inst::kOptionLock) {
      if (ASMJIT_UNLIKELY(!(iFlags & X86Inst::kFlagLock) && !(options & kLockXAcqRel)))
        return DebugUtils::errored(kErrorInvalidLockPrefix);

      if (ASMJIT_UNLIKELY(opCount < 1 || !opArray[0].isMem()))
        return DebugUtils::errored(kErrorInvalidLockPrefix);
    }

    if (options & kLockXAcqRel) {
      if (ASMJIT_UNLIKELY(!(options & X86Inst::kOptionLock) || (options & kLockXAcqRel) == kLockXAcqRel))
        return DebugUtils::errored(kErrorInvalidPrefixCombination);

      if (ASMJIT_UNLIKELY((options & X86Inst::kOptionXAcquire) && !(iFlags & X86Inst::kFlagXAcquire)))
        return DebugUtils::errored(kErrorInvalidXAcquirePrefix);

      if (ASMJIT_UNLIKELY((options & X86Inst::kOptionXRelease) && !(iFlags & X86Inst::kFlagXRelease)))
        return DebugUtils::errored(kErrorInvalidXReleasePrefix);
    }
  }

  // Validate REP and REPNZ prefixes.
  const uint32_t kRepRepnz = X86Inst::kOptionRep | X86Inst::kOptionRepnz;
  if (options & kRepRepnz) {
    if (ASMJIT_UNLIKELY((options & kRepRepnz) == kRepRepnz))
      return DebugUtils::errored(kErrorInvalidPrefixCombination);

    if (ASMJIT_UNLIKELY((options & X86Inst::kOptionRep) && !(iFlags & X86Inst::kFlagRep)))
      return DebugUtils::errored(kErrorInvalidRepPrefix);

    if (ASMJIT_UNLIKELY((options & X86Inst::kOptionRepnz) && !(iFlags & X86Inst::kFlagRepnz)))
      return DebugUtils::errored(kErrorInvalidRepPrefix);
  }

  // Translate the given operands to `X86Inst::OSignature`.
  X86Inst::OSignature oSigTranslated[6];
  uint32_t combinedOpFlags = 0;
  uint32_t combinedRegMask = 0;

  const X86Mem* memOp = nullptr;

  for (i = 0; i < opCount; i++) {
    const Operand_& op = opArray[i];
    if (op.getOp() == Operand::kOpNone) break;

    uint32_t opFlags = 0;
    uint32_t memFlags = 0;
    uint32_t regMask = 0;

    switch (op.getOp()) {
      case Operand::kOpReg: {
        uint32_t regType = op.as<Reg>().getType();
        if (ASMJIT_UNLIKELY(regType >= X86Reg::kRegCount))
          return DebugUtils::errored(kErrorInvalidRegType);

        opFlags = _x86OpFlagFromRegType[regType];
        if (ASMJIT_UNLIKELY(opFlags == 0))
          return DebugUtils::errored(kErrorInvalidRegType);

        // If `regId` is equal or greater than Operand::kPackedIdMin it means
        // that the register is virtual and its index will be assigned later
        // by the register allocator. We must pass unless asked to disallow
        // virtual registers.
        // TODO: We need an option to refuse virtual regs here.
        uint32_t regId = op.getId();
        if (regId < Operand::kPackedIdMin) {
          if (ASMJIT_UNLIKELY(regId >= 32))
            return DebugUtils::errored(kErrorInvalidPhysId);

          regMask = Utils::mask(regId);
          if (ASMJIT_UNLIKELY((vd->allowedRegMask[regType] & regMask) == 0))
            return DebugUtils::errored(kErrorInvalidPhysId);

          combinedRegMask |= regMask;
        }
        else {
          regMask = 0xFFFFFFFFU;
        }
        break;
      }

      // TODO: Validate base and index and combine with `combinedRegMask`.
      case Operand::kOpMem: {
        const X86Mem& m = op.as<X86Mem>();

        uint32_t baseType = m.getBaseType();
        uint32_t indexType = m.getIndexType();

        memOp = &m;

        if (m.getSegmentId() > 6)
          return DebugUtils::errored(kErrorInvalidSegment);

        if (baseType) {
          uint32_t baseId = m.getBaseId();

          if (m.isRegHome()) {
            // Home address of virtual register. In such case we don't want to
            // validate the type of the base register as it will always be patched
            // to ESP|RSP.
          }
          else {
            if (ASMJIT_UNLIKELY((vd->allowedMemBaseRegs & (1U << baseType)) == 0))
              return DebugUtils::errored(kErrorInvalidAddress);
          }

          // Create information that will be validated only if this is an implicit
          // memory operand. Basically only usable for string instructions and other
          // instructions where memory operand is implicit and has 'seg:[reg]' form.
          if (baseId < Operand::kPackedIdMin) {
            // Physical base id.
            regMask = Utils::mask(baseId);
            combinedRegMask |= regMask;
          }
          else {
            // Virtual base id - will the whole mask for implicit mem validation.
            // The register is not assigned yet, so we cannot predict the phys id.
            regMask = 0xFFFFFFFFU;
          }

          if (!indexType && !m.getOffsetLo32())
            memFlags |= X86Inst::kMemOpBaseOnly;
        }
        else {
          // Base is an address, make sure that the address doesn't overflow 32-bit
          // integer (either int32_t or uint32_t) in 32-bit targets.
          int64_t offset = m.getOffset();
          if (archMask == X86Inst::kArchMaskX86 && !Utils::isInt32(offset) && !Utils::isUInt32(offset))
            return DebugUtils::errored(kErrorInvalidAddress);
        }

        if (indexType) {
          if (ASMJIT_UNLIKELY((vd->allowedMemIndexRegs & (1U << indexType)) == 0))
            return DebugUtils::errored(kErrorInvalidAddress);

          if (indexType == X86Reg::kRegXmm) {
            opFlags |= X86Inst::kOpVm;
            memFlags |= X86Inst::kMemOpVm32x | X86Inst::kMemOpVm64x;
          }
          else if (indexType == X86Reg::kRegYmm) {
            opFlags |= X86Inst::kOpVm;
            memFlags |= X86Inst::kMemOpVm32y | X86Inst::kMemOpVm64y;
          }
          else if (indexType == X86Reg::kRegZmm) {
            opFlags |= X86Inst::kOpVm;
            memFlags |= X86Inst::kMemOpVm32z | X86Inst::kMemOpVm64z;
          }
          else {
            opFlags |= X86Inst::kOpMem;
            if (baseType)
              memFlags |= X86Inst::kMemOpMib;
          }

          uint32_t indexId = m.getIndexId();
          if (indexId < Operand::kPackedIdMin)
            combinedRegMask |= Utils::mask(indexId);

          // Only used for implicit memory operands having 'seg:[reg]' form, so clear it.
          regMask = 0;
        }
        else {
          opFlags |= X86Inst::kOpMem;
        }

        switch (m.getSize()) {
          case  0: memFlags |= X86Inst::kMemOpAny ; break;
          case  1: memFlags |= X86Inst::kMemOpM8  ; break;
          case  2: memFlags |= X86Inst::kMemOpM16 ; break;
          case  4: memFlags |= X86Inst::kMemOpM32 ; break;
          case  6: memFlags |= X86Inst::kMemOpM48 ; break;
          case  8: memFlags |= X86Inst::kMemOpM64 ; break;
          case 10: memFlags |= X86Inst::kMemOpM80 ; break;
          case 16: memFlags |= X86Inst::kMemOpM128; break;
          case 32: memFlags |= X86Inst::kMemOpM256; break;
          case 64: memFlags |= X86Inst::kMemOpM512; break;
          default:
            return DebugUtils::errored(kErrorInvalidOperandSize);
        }

        break;
      }

      case Operand::kOpImm: {
        uint64_t immValue = op.as<Imm>().getUInt64();
        uint32_t immFlags = 0;

        if (static_cast<int64_t>(immValue) >= 0) {
          const uint32_t k32AndMore = X86Inst::kOpI32 | X86Inst::kOpU32 |
                                      X86Inst::kOpI64 | X86Inst::kOpU64 ;

          if (immValue <= 0xFU)
            immFlags = X86Inst::kOpU4 | X86Inst::kOpI8 | X86Inst::kOpU8 | X86Inst::kOpI16 | X86Inst::kOpU16 | k32AndMore;
          else if (immValue <= 0x7FU)
            immFlags = X86Inst::kOpI8 | X86Inst::kOpU8 | X86Inst::kOpI16 | X86Inst::kOpU16 | k32AndMore;
          else if (immValue <= 0xFFU)
            immFlags = X86Inst::kOpU8 | X86Inst::kOpI16 | X86Inst::kOpU16 | k32AndMore;
          else if (immValue <= 0x7FFFU)
            immFlags = X86Inst::kOpI16 | X86Inst::kOpU16 | k32AndMore;
          else if (immValue <= 0xFFFFU)
            immFlags = X86Inst::kOpU16 | k32AndMore;
          else if (immValue <= 0x7FFFFFFFU)
            immFlags = k32AndMore;
          else if (immValue <= 0xFFFFFFFFU)
            immFlags = X86Inst::kOpU32 | X86Inst::kOpI64 | X86Inst::kOpU64;
          else if (immValue <= ASMJIT_UINT64_C(0x7FFFFFFFFFFFFFFF))
            immFlags = X86Inst::kOpI64 | X86Inst::kOpU64;
          else
            immFlags = X86Inst::kOpU64;
        }
        else {
          // 2s complement negation, as our number is unsigned...
          immValue = (~immValue + 1);

          if (immValue <= 0x80U)
            immFlags = X86Inst::kOpI8 | X86Inst::kOpI16 | X86Inst::kOpI32 | X86Inst::kOpI64;
          else if (immValue <= 0x8000U)
            immFlags = X86Inst::kOpI16 | X86Inst::kOpI32 | X86Inst::kOpI64;
          else if (immValue <= 0x80000000U)
            immFlags = X86Inst::kOpI32 | X86Inst::kOpI64;
          else
            immFlags = X86Inst::kOpI64;
        }
        opFlags |= immFlags;
        break;
      }

      case Operand::kOpLabel: {
        opFlags |= X86Inst::kOpRel8 | X86Inst::kOpRel32;
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidState);
    }

    X86Inst::OSignature& tod = oSigTranslated[i];
    tod.flags = opFlags;
    tod.memFlags = static_cast<uint16_t>(memFlags);
    tod.regMask = static_cast<uint8_t>(regMask & 0xFFU);
    combinedOpFlags |= opFlags;
  }

  // Decrease the number of operands of those that are none. This is important
  // as Assembler and CodeCompiler may just pass more operands where some of
  // them are none (it means that no operand is given at that index). However,
  // validate that there are no gaps (like [reg, none, reg] or [none, reg]).
  if (i < opCount) {
    while (--opCount > i)
      if (ASMJIT_UNLIKELY(!opArray[opCount].isNone()))
        return DebugUtils::errored(kErrorInvalidState);
  }

  // Validate X86 and X64 specific cases.
  if (archMask == kArchMaskX86) {
    // Illegal use of 64-bit register in 32-bit mode.
    if (ASMJIT_UNLIKELY((combinedOpFlags & X86Inst::kOpGpq) != 0))
      return DebugUtils::errored(kErrorInvalidUseOfGpq);
  }
  else {
    // Illegal use of a high 8-bit register with REX prefix.
    if (ASMJIT_UNLIKELY((combinedOpFlags & X86Inst::kOpGpbHi) != 0 && (combinedRegMask & 0xFFFFFF00U) != 0))
      return DebugUtils::errored(kErrorInvalidUseOfGpbHi);
  }

  // Validate instruction operands.
  const X86Inst::CommonData* commonData = &iData->getCommonData();
  const X86Inst::ISignature* iSig = X86InstDB::iSignatureData + commonData->_iSignatureIndex;
  const X86Inst::ISignature* iEnd = iSig                      + commonData->_iSignatureCount;

  if (iSig != iEnd) {
    const X86Inst::OSignature* oSigData = X86InstDB::oSignatureData;

    // If set it means that we matched a signature where only immediate value
    // was out of bounds. We can return a more descriptive error if we know this.
    bool globalImmOutOfRange = false;

    do {
      // Check if the architecture is compatible.
      if ((iSig->archMask & archMask) == 0) continue;

      // Compare the operands table with reference operands.
      uint32_t j = 0;
      uint32_t iCount = iSig->opCount;
      bool localImmOutOfRange = false;

      if (iCount == opCount) {
        for (j = 0; j < opCount; j++)
          if (!X86Inst_checkOSig(oSigTranslated[j], oSigData[iSig->operands[j]], localImmOutOfRange))
            break;
      }
      else if (iCount - iSig->implicit == opCount) {
        uint32_t r = 0;
        for (j = 0; j < opCount && r < iCount; j++, r++) {
          const X86Inst::OSignature* oChk = oSigTranslated + j;
          const X86Inst::OSignature* oRef;
Next:
          oRef = oSigData + iSig->operands[r];
          // Skip implicit.
          if ((oRef->flags & X86Inst::kOpImplicit) != 0) {
            if (++r >= iCount)
              break;
            else
              goto Next;
          }

          if (!X86Inst_checkOSig(*oChk, *oRef, localImmOutOfRange))
            break;
        }
      }

      if (j == opCount) {
        if (!localImmOutOfRange) {
          // Match, must clear possible `globalImmOutOfRange`.
          globalImmOutOfRange = false;
          break;
        }
        globalImmOutOfRange = localImmOutOfRange;
      }
    } while (++iSig != iEnd);

    if (iSig == iEnd) {
      if (globalImmOutOfRange)
        return DebugUtils::errored(kErrorInvalidImmediate);
      else
        return DebugUtils::errored(kErrorInvalidInstruction);
    }
  }

  // Validate AVX-512 options:
  const uint32_t kAvx512Options = X86Inst::kOptionZMask   |
                                  X86Inst::kOption1ToX    |
                                  X86Inst::kOptionER      |
                                  X86Inst::kOptionSAE     ;

  if (!extraOp.isNone() || (options & kAvx512Options)) {
    if (commonData->hasFlag(X86Inst::kFlagEvex)) {
      // Validate AVX-512 {k} and {k}{z}.
      if (!extraOp.isNone()) {
        // Mask can only be specified by a 'k' register.
        if (ASMJIT_UNLIKELY(!X86Reg::isK(extraOp)))
          return DebugUtils::errored(kErrorInvalidKMaskReg);

        if (ASMJIT_UNLIKELY(!commonData->hasAvx512K()))
          return DebugUtils::errored(kErrorInvalidKMaskUse);
      }

      if ((options & X86Inst::kOptionZMask)) {
        if (ASMJIT_UNLIKELY((options & X86Inst::kOptionZMask) != 0 && !commonData->hasAvx512Z()))
          return DebugUtils::errored(kErrorInvalidKZeroUse);
      }

      // Validate AVX-512 broadcast {1tox}.
      if (options & X86Inst::kOption1ToX) {
        if (ASMJIT_UNLIKELY(!memOp))
          return DebugUtils::errored(kErrorInvalidBroadcast);

        uint32_t size = memOp->getSize();
        if (size != 0) {
          // The the size is specified it has to match the broadcast size.
          if (ASMJIT_UNLIKELY(commonData->hasAvx512B32() && size != 4))
            return DebugUtils::errored(kErrorInvalidBroadcast);

          if (ASMJIT_UNLIKELY(commonData->hasAvx512B64() && size != 8))
            return DebugUtils::errored(kErrorInvalidBroadcast);
        }
      }

      // Validate AVX-512 {sae} and {er}.
      if (options & (X86Inst::kOptionSAE | X86Inst::kOptionER)) {
        // Rounding control is impossible if the instruction is not reg-to-reg.
        if (ASMJIT_UNLIKELY(memOp))
          return DebugUtils::errored(kErrorInvalidEROrSAE);

        // Check if {sae} or {er} is supported by the instruction.
        if (options & X86Inst::kOptionER) {
          // NOTE: if both {sae} and {er} are set, we don't care, as {sae} is implied.
          if (ASMJIT_UNLIKELY(!commonData->hasAvx512ER()))
            return DebugUtils::errored(kErrorInvalidEROrSAE);

          // {er} is defined for scalar ops or vector ops using zmm (LL = 10). We
          // don't need any more bits in the instruction database to be able to
          // validate this, as each AVX512 instruction that has broadcast is vector
          // instruction (in this case we require zmm registers), otherwise it's a
          // scalar instruction, which is valid.
          if (commonData->hasAvx512B()) {
            // Supports broadcast, thus we require LL to be '10', which means there
            // have to be zmm registers used. We don't calculate LL here, but we know
            // that it would be '10' if there is at least one ZMM register used.

            // There is no 'ER' enabled instruction with less than two operands.
            ASMJIT_ASSERT(opCount >= 2);
            if (ASMJIT_UNLIKELY(!X86Reg::isZmm(opArray[0]) && !X86Reg::isZmm(opArray[1])))
              return DebugUtils::errored(kErrorInvalidEROrSAE);
          }
        }
        else {
          // {sae} doesn't have the same limitations as {er}, this is enough.
          if (ASMJIT_UNLIKELY(!commonData->hasAvx512SAE()))
            return DebugUtils::errored(kErrorInvalidEROrSAE);
        }
      }
    }
    else {
      // Not AVX512 instruction - maybe OpExtra is xCX register used by REP/REPNZ prefix. Otherwise the instruction is invalid.
      if ((options & kAvx512Options) || (options & (X86Inst::kOptionRep | X86Inst::kOptionRepnz)) == 0)
        return DebugUtils::errored(kErrorInvalidInstruction);
    }
  }

  return kErrorOk;
}